

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADPComponentDiscreteActions.cpp
# Opt level: O1

ActionDiscrete * __thiscall
MADPComponentDiscreteActions::GetActionDiscrete
          (MADPComponentDiscreteActions *this,Index agentI,Index a)

{
  size_t sVar1;
  ostream *poVar2;
  undefined8 *puVar3;
  stringstream ss;
  stringstream asStack_1a8 [16];
  ostream local_198 [376];
  
  if (this->_m_initialized == false) {
    std::__cxx11::stringstream::stringstream(asStack_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_198,"MADPComponentDiscreteActions::GetAction(",0x28);
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)local_198);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") - Error: not initialized. ",0x1c);
    std::endl<char,std::char_traits<char>>(poVar2);
    puVar3 = (undefined8 *)__cxa_allocate_exception(0x28);
    *puVar3 = &PTR__E_0059bd80;
    std::__cxx11::stringbuf::str();
    __cxa_throw(puVar3,&E::typeinfo,E::~E);
  }
  if ((ulong)agentI <
      (ulong)((long)(this->_m_nrActions).
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(this->_m_nrActions).
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3)) {
    sVar1 = GetNrActions(this,agentI);
    if (a < sVar1) {
      return (ActionDiscrete *)
             ((ulong)a * 0x58 +
             *(long *)&(this->_m_actionVecs).
                       super__Vector_base<std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>,_std::allocator<std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[agentI].
                       super__Vector_base<ActionDiscrete,_std::allocator<ActionDiscrete>_>._M_impl.
                       super__Vector_impl_data);
    }
    std::__cxx11::stringstream::stringstream(asStack_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_198,
               "WARNING MADPComponentDiscreteActions::GetAction(Index agentI, Index a) index a out of bounds"
               ,0x5c);
    std::endl<char,std::char_traits<char>>(local_198);
    puVar3 = (undefined8 *)__cxa_allocate_exception(0x28);
    *puVar3 = &PTR__E_0059bd80;
    std::__cxx11::stringbuf::str();
    __cxa_throw(puVar3,&E::typeinfo,E::~E);
  }
  std::__cxx11::stringstream::stringstream(asStack_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_198,
             "WARNING MADPComponentDiscreteActions::GetAction(Index agentI, Index a) index agentI out of bounds"
             ,0x61);
  std::endl<char,std::char_traits<char>>(local_198);
  puVar3 = (undefined8 *)__cxa_allocate_exception(0x28);
  *puVar3 = &PTR__E_0059bd80;
  std::__cxx11::stringbuf::str();
  __cxa_throw(puVar3,&E::typeinfo,E::~E);
}

Assistant:

const ActionDiscrete* MADPComponentDiscreteActions::GetActionDiscrete(Index agentI, Index a) const
{
    if(!_m_initialized)
    {
        stringstream ss;
            ss << "MADPComponentDiscreteActions::GetAction("<< 
            agentI<<") - Error: not initialized. "<<endl;
        throw E(ss);
    }
    if(agentI < _m_nrActions.size() )
    {
        if(a < GetNrActions(agentI) )
        {
            return (&_m_actionVecs[agentI][a]);
        }
        //else
        stringstream ss;
            ss << "WARNING MADPComponentDiscreteActions::GetAction(Index agentI, Index a) index a out of bounds"<<endl;
        throw E(ss);
    }
    //else
    stringstream ss;
    ss << "WARNING MADPComponentDiscreteActions::GetAction(Index agentI, Index a) index agentI out of bounds"<<endl;   
    throw E(ss);
}